

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

SeatPromptResult *
term_get_userpass_input(SeatPromptResult *__return_storage_ptr__,Terminal *term,prompts_t *p)

{
  prompt_t *ppVar1;
  char *pcVar2;
  _Bool _Var3;
  uint uVar4;
  SeatPromptResultKind SVar5;
  ulong *ptr;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  strbuf *psVar9;
  long lVar10;
  LdiscInputToken LVar11;
  ptrlen whole;
  ptrlen whole_00;
  ptrlen suffix;
  ptrlen suffix_00;
  char c;
  SeatPromptResult local_78;
  SeatPromptResult local_50;
  
  if (term->ldisc == (Ldisc *)0x0) {
    make_spr_sw_abort_static(&local_50,"Terminal not prepared for interactive prompts");
    local_78.errdata_lit = local_50.errdata_lit;
    local_78.errdata_u = local_50.errdata_u;
    local_78._28_4_ = local_50._28_4_;
    local_78.kind = local_50.kind;
    local_78._4_4_ = local_50._4_4_;
    local_78.errfn = local_50.errfn;
    if (p->callback == (toplevel_callback_fn_t)0x0) goto LAB_001107d0;
    queue_toplevel_callback(p->callback,p->callback_ctx);
    if (term->ldisc != (Ldisc *)0x0) {
      ldisc_enable_prompt_callback(term->ldisc,(prompts_t *)0x0);
    }
    (p->spr).errdata_lit = local_78.errdata_lit;
    (p->spr).errdata_u = local_78.errdata_u;
    *(undefined4 *)&(p->spr).field_0x1c = local_78._28_4_;
    (p->spr).kind = local_78.kind;
    *(undefined4 *)&(p->spr).field_0x4 = local_78._4_4_;
    (p->spr).errfn = local_78.errfn;
  }
  else {
    if ((p->spr).kind == SPRK_INCOMPLETE) {
      ptr = (ulong *)p->data;
      if (ptr == (ulong *)0x0) {
        ptr = (ulong *)safemalloc(1,0x10,0);
        p->data = ptr;
        (p->spr).kind = SPRK_INCOMPLETE;
        (p->spr).errdata_lit = (char *)0x0;
        *ptr = 0;
        *(undefined1 *)(ptr + 1) = 0;
        if ((p->name_reqd == true) && (pcVar2 = p->name, pcVar2 != (char *)0x0)) {
          sVar6 = strlen(pcVar2);
          term_data(term,pcVar2,sVar6);
          whole.len = sVar6;
          whole.ptr = pcVar2;
          suffix.len = 1;
          suffix.ptr = "\n";
          _Var3 = ptrlen_endswith(whole,suffix,(ptrlen *)0x0);
          if (!_Var3) {
            term_data(term,"\r\n",2);
          }
        }
        pcVar2 = p->instruction;
        if (pcVar2 != (char *)0x0) {
          sVar6 = strlen(pcVar2);
          term_data(term,pcVar2,sVar6);
          whole_00.len = sVar6;
          whole_00.ptr = pcVar2;
          suffix_00.len = 1;
          suffix_00.ptr = "\n";
          _Var3 = ptrlen_endswith(whole_00,suffix_00,(ptrlen *)0x0);
          if (!_Var3) {
            term_data(term,"\r\n",2);
          }
        }
        uVar7 = p->n_prompts;
        if (0 < (int)uVar7) {
          lVar10 = 0;
          do {
            prompt_set_result(p->prompts[lVar10],"");
            lVar10 = lVar10 + 1;
            uVar7 = p->n_prompts;
          } while (lVar10 < (int)uVar7);
        }
      }
      else {
        uVar7 = p->n_prompts;
      }
      uVar8 = *ptr;
      if (uVar8 < uVar7) {
        while( true ) {
          ppVar1 = p->prompts[uVar8];
          if ((char)ptr[1] == '\0') {
            pcVar2 = ppVar1->prompt;
            sVar6 = strlen(pcVar2);
            term_data(term,pcVar2,sVar6);
            *(undefined1 *)(ptr + 1) = 1;
          }
          _Var3 = ldisc_has_input_buffered(term->ldisc);
          if (!_Var3) break;
LAB_0011055f:
          do {
            while( true ) {
              _Var3 = ldisc_has_input_buffered(term->ldisc);
              if (!_Var3) goto LAB_001106d7;
              LVar11 = ldisc_get_input_token(term->ldisc);
              uVar4 = LVar11.field_1._0_4_;
              if (((undefined1  [12])LVar11 & (undefined1  [12])0x1) != (undefined1  [12])0x0)
              break;
              local_78.kind._0_1_ = LVar11.field_1._0_1_;
              uVar4 = uVar4 & 0xff;
              if (uVar4 < 0x1b) {
                switch(uVar4) {
                case 3:
                case 4:
                  goto switchD_001105ba_caseD_3;
                case 8:
                  goto switchD_001105ba_caseD_8;
                case 10:
                case 0xd:
                  goto switchD_001105ba_caseD_a;
                default:
                  if (uVar4 == 0x15) goto LAB_001106a5;
                case 5:
                case 6:
                case 7:
                case 9:
                case 0xb:
                case 0xc:
switchD_001105ba_caseD_5:
                  if (((ppVar1->echo != true) ||
                      (0x9f < (byte)(undefined1)local_78.kind ||
                       (byte)((undefined1)local_78.kind - 0x20) < 0x5f)) &&
                     (BinarySink_put_byte(ppVar1->result->binarysink_,(undefined1)local_78.kind),
                     ppVar1->echo == true)) {
                    term_data(term,&local_78,1);
                  }
                }
              }
              else if (uVar4 == 0x1b) {
LAB_001106a5:
                while (psVar9 = ppVar1->result, psVar9->len != 0) {
                  if (ppVar1->echo == true) {
                    term_data(term,"\b \b",3);
                    psVar9 = ppVar1->result;
                  }
                  strbuf_shrink_by(psVar9,1);
                }
              }
              else {
                if (uVar4 != 0x7f) goto switchD_001105ba_caseD_5;
switchD_001105ba_caseD_8:
                psVar9 = ppVar1->result;
                if (psVar9->len != 0) {
                  if (ppVar1->echo == true) {
                    term_data(term,"\b \b",3);
                    psVar9 = ppVar1->result;
                  }
                  strbuf_shrink_by(psVar9,1);
                }
              }
            }
            if ((int)uVar4 < 0xb) {
              if (uVar4 == 6) {
                local_78.kind._0_1_ = 8;
                goto switchD_001105ba_caseD_8;
              }
              if (uVar4 == 1) {
LAB_001106ea:
                local_78.kind._0_1_ = 3;
switchD_001105ba_caseD_3:
                term_data(term,"\r\n",2);
                safefree(ptr);
                p->data = (void *)0x0;
                if (p->callback == (toplevel_callback_fn_t)0x0) goto LAB_001107d0;
                queue_toplevel_callback(p->callback,p->callback_ctx);
                if (term->ldisc != (Ldisc *)0x0) {
                  ldisc_enable_prompt_callback(term->ldisc,(prompts_t *)0x0);
                }
                SVar5 = SPRK_USER_ABORT;
                goto LAB_001107bb;
              }
              goto LAB_0011055f;
            }
            if (uVar4 == 0xb) goto LAB_001106ea;
          } while (uVar4 != 0xe);
          local_78.kind._0_1_ = 0xd;
switchD_001105ba_caseD_a:
          term_data(term,"\r\n",2);
          *ptr = *ptr + 1;
          *(undefined1 *)(ptr + 1) = 0;
LAB_001106d7:
          uVar8 = *ptr;
          uVar7 = p->n_prompts;
          if (uVar7 <= uVar8) goto LAB_00110750;
        }
        uVar8 = *ptr;
        uVar7 = p->n_prompts;
      }
LAB_00110750:
      if (uVar8 < uVar7) {
        ldisc_enable_prompt_callback(term->ldisc,p);
        __return_storage_ptr__->kind = SPRK_INCOMPLETE;
        __return_storage_ptr__->errdata_lit = (char *)0x0;
        return __return_storage_ptr__;
      }
      safefree(ptr);
      p->data = (void *)0x0;
      if (p->callback != (toplevel_callback_fn_t)0x0) {
        queue_toplevel_callback(p->callback,p->callback_ctx);
        if (term->ldisc != (Ldisc *)0x0) {
          ldisc_enable_prompt_callback(term->ldisc,(prompts_t *)0x0);
        }
        SVar5 = SPRK_OK;
LAB_001107bb:
        (p->spr).kind = SVar5;
        (p->spr).errdata_lit = (char *)0x0;
        __return_storage_ptr__->kind = SVar5;
        __return_storage_ptr__->errdata_lit = (char *)0x0;
        return __return_storage_ptr__;
      }
LAB_001107d0:
      __assert_fail("p->callback && \"Asynchronous userpass input requires a callback\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x1e39,
                    "SeatPromptResult signal_prompts_t(Terminal *, prompts_t *, SeatPromptResult)");
    }
    local_78.kind = (p->spr).kind;
    local_78._4_4_ = *(undefined4 *)&(p->spr).field_0x4;
    local_78.errfn._0_4_ = *(undefined4 *)&(p->spr).errfn;
    local_78.errfn._4_4_ = *(undefined4 *)((long)&(p->spr).errfn + 4);
    local_78.errdata_lit._0_4_ = *(undefined4 *)&(p->spr).errdata_lit;
    local_78.errdata_lit._4_4_ = *(undefined4 *)((long)&(p->spr).errdata_lit + 4);
    local_78.errdata_u = (p->spr).errdata_u;
    local_78._28_4_ = *(undefined4 *)&(p->spr).field_0x1c;
  }
  *(undefined4 *)&__return_storage_ptr__->errdata_lit = local_78.errdata_lit._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->errdata_lit + 4) = local_78.errdata_lit._4_4_;
  __return_storage_ptr__->errdata_u = local_78.errdata_u;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = local_78._28_4_;
  __return_storage_ptr__->kind = local_78.kind;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_78._4_4_;
  *(undefined4 *)&__return_storage_ptr__->errfn = local_78.errfn._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->errfn + 4) = local_78.errfn._4_4_;
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult term_get_userpass_input(Terminal *term, prompts_t *p)
{
    if (!term->ldisc) {
        /* Can't handle interactive prompts without an ldisc */
        return signal_prompts_t(term, p, SPR_SW_ABORT(
            "Terminal not prepared for interactive prompts"));
    }

    if (p->spr.kind != SPRK_INCOMPLETE) {
        /* We've already finished these prompts, so return the same
         * result again */
        return p->spr;
    }

    struct term_userpass_state *s = (struct term_userpass_state *)p->data;

    if (!s) {
        /*
         * First call. Set some stuff up.
         */
        p->data = s = snew(struct term_userpass_state);
        p->spr = SPR_INCOMPLETE;
        s->curr_prompt = 0;
        s->done_prompt = false;
        /* We only print the `name' caption if we have to... */
        if (p->name_reqd && p->name) {
            ptrlen plname = ptrlen_from_asciz(p->name);
            term_write(term, plname);
            if (!ptrlen_endswith(plname, PTRLEN_LITERAL("\n"), NULL))
                term_write(term, PTRLEN_LITERAL("\r\n"));
        }
        /* ...but we always print any `instruction'. */
        if (p->instruction) {
            ptrlen plinst = ptrlen_from_asciz(p->instruction);
            term_write(term, plinst);
            if (!ptrlen_endswith(plinst, PTRLEN_LITERAL("\n"), NULL))
                term_write(term, PTRLEN_LITERAL("\r\n"));
        }
        /*
         * Zero all the results, in case we abort half-way through.
         */
        {
            int i;
            for (i = 0; i < (int)p->n_prompts; i++)
                prompt_set_result(p->prompts[i], "");
        }
    }

    while (s->curr_prompt < p->n_prompts) {

        prompt_t *pr = p->prompts[s->curr_prompt];
        bool finished_prompt = false;

        if (!s->done_prompt) {
            term_write(term, ptrlen_from_asciz(pr->prompt));
            s->done_prompt = true;
        }

        /* Breaking out here ensures that the prompt is printed even
         * if we're now waiting for user data. */
        if (!ldisc_has_input_buffered(term->ldisc))
            break;

        /* FIXME: should we be using local-line-editing code instead? */
        while (!finished_prompt && ldisc_has_input_buffered(term->ldisc)) {
            LdiscInputToken tok = ldisc_get_input_token(term->ldisc);

            char c;
            if (tok.is_special) {
                switch (tok.code) {
                  case SS_EOL: c = 13; break;
                  case SS_EC: c = 8; break;
                  case SS_IP: c = 3; break;
                  case SS_EOF: c = 3; break;
                  default: continue;
                }
            } else {
                c = tok.chr;
            }

            switch (c) {
              case 10:
              case 13:
                term_write(term, PTRLEN_LITERAL("\r\n"));
                /* go to next prompt, if any */
                s->curr_prompt++;
                s->done_prompt = false;
                finished_prompt = true; /* break out */
                break;
              case 8:
              case 127:
                if (pr->result->len > 0) {
                    if (pr->echo)
                        term_write(term, PTRLEN_LITERAL("\b \b"));
                    strbuf_shrink_by(pr->result, 1);
                }
                break;
              case 21:
              case 27:
                while (pr->result->len > 0) {
                    if (pr->echo)
                        term_write(term, PTRLEN_LITERAL("\b \b"));
                    strbuf_shrink_by(pr->result, 1);
                }
                break;
              case 3:
              case 4:
                /* Immediate abort. */
                term_write(term, PTRLEN_LITERAL("\r\n"));
                sfree(s);
                p->data = NULL;
                return signal_prompts_t(term, p, SPR_USER_ABORT);
              default:
                /*
                 * This simplistic check for printability is disabled
                 * when we're doing password input, because some people
                 * have control characters in their passwords.
                 */
                if (!pr->echo || (c >= ' ' && c <= '~') ||
                     ((unsigned char) c >= 160)) {
                    put_byte(pr->result, c);
                    if (pr->echo)
                        term_write(term, make_ptrlen(&c, 1));
                }
                break;
            }
        }

    }

    if (s->curr_prompt < p->n_prompts) {
        ldisc_enable_prompt_callback(term->ldisc, p);
        return SPR_INCOMPLETE;
    } else {
        sfree(s);
        p->data = NULL;
        return signal_prompts_t(term, p, SPR_OK);
    }
}